

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

UCVarValue FBaseCVar::FromInt(int value,ECVarType type)

{
  UCVarValue ret;
  char *local_10;
  
  switch(type) {
  case CVAR_Bool:
    local_10 = (char *)CONCAT71(local_10._1_7_,value != 0);
    break;
  case CVAR_Int:
    local_10 = (char *)CONCAT44(local_10._4_4_,value);
    break;
  case CVAR_Float:
    local_10 = (char *)CONCAT44(local_10._4_4_,(float)value);
    break;
  case CVAR_String:
    mysnprintf(cstrbuf,0x28,"%i");
    local_10 = cstrbuf;
    break;
  case CVAR_GUID:
    local_10 = (char *)0x0;
  }
  return (UCVarValue)local_10;
}

Assistant:

UCVarValue FBaseCVar::FromInt (int value, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = value != 0;
		break;

	case CVAR_Int:
		ret.Int = value;
		break;

	case CVAR_Float:
		ret.Float = (float)value;
		break;

	case CVAR_String:
		mysnprintf (cstrbuf, countof(cstrbuf), "%i", value);
		ret.String = cstrbuf;
		break;

	case CVAR_GUID:
		ret.pGUID = NULL;
		break;

	default:
		break;
	}

	return ret;
}